

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

uint64_t roaring64_iterator_read(roaring64_iterator_t *it,uint64_t *buf,uint64_t count)

{
  art_val_t *paVar1;
  _Bool _Var2;
  _Bool _Var3;
  roaring_container_iterator_t rVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint16_t low16;
  uint16_t local_52;
  uint64_t local_50;
  uint32_t container_consumed;
  art_iterator_t *local_40;
  ulong local_38;
  
  local_40 = &it->art_it;
  uVar7 = 0;
  local_38 = count;
  while( true ) {
    if (it->has_value != true) {
      return uVar7;
    }
    uVar8 = local_38 - uVar7;
    if (local_38 < uVar7 || uVar8 == 0) break;
    paVar1 = (it->art_it).value;
    low16 = (uint16_t)it->value;
    if (0xfffffffe < uVar8) {
      uVar8 = 0xffffffff;
    }
    _Var2 = container_iterator_read_into_uint64
                      (*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],&it->container_it,
                       it->high48,buf,(uint32_t)uVar8,&container_consumed,&low16);
    uVar8 = (ulong)container_consumed;
    uVar7 = uVar7 + uVar8;
    if (_Var2) {
      it->has_value = true;
      it->value = (ulong)low16 | it->high48;
      local_50 = uVar7;
    }
    else {
      _Var3 = art_iterator_next(local_40);
      it->has_value = _Var3;
      if (_Var3) {
        uVar5 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
        uVar6 = (ulong)*(uint6 *)(it->art_it).key;
        it->high48 = (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                     (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                     (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
        paVar1 = (it->art_it).value;
        local_52 = 0;
        rVar4 = container_init_iterator
                          (*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],&local_52);
        (it->container_it).index = rVar4.index;
        it->value = (ulong)local_52 | it->high48;
        it->has_value = true;
      }
    }
    buf = buf + uVar8;
    if (_Var2) {
      return local_50;
    }
  }
  return uVar7;
}

Assistant:

uint64_t roaring64_iterator_read(roaring64_iterator_t *it, uint64_t *buf,
                                 uint64_t count) {
    uint64_t consumed = 0;
    while (it->has_value && consumed < count) {
        uint32_t container_consumed;
        leaf_t *leaf = (leaf_t *)it->art_it.value;
        uint16_t low16 = (uint16_t)it->value;
        uint32_t container_count = UINT32_MAX;
        if (count - consumed < (uint64_t)UINT32_MAX) {
            container_count = count - consumed;
        }
        bool has_value = container_iterator_read_into_uint64(
            leaf->container, leaf->typecode, &it->container_it, it->high48, buf,
            container_count, &container_consumed, &low16);
        consumed += container_consumed;
        buf += container_consumed;
        if (has_value) {
            it->has_value = true;
            it->value = it->high48 | low16;
            assert(consumed == count);
            return consumed;
        }
        it->has_value = art_iterator_next(&it->art_it);
        if (it->has_value) {
            roaring64_iterator_init_at_leaf_first(it);
        }
    }
    return consumed;
}